

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O1

void edition_unittest::TestFieldOrderings::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  char *pcVar2;
  size_t sVar3;
  MessageLite *from_msg_00;
  MessageLite *to_msg_00;
  ulong uVar4;
  undefined8 *puVar5;
  void *pvVar6;
  Nonnull<const_char_*> pcVar7;
  Arena *arena;
  Arena *arena_00;
  string_view value;
  
  arena_00 = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena_00 & 1) != 0) {
    arena_00 = *(Arena **)((ulong)arena_00 & 0xfffffffffffffffe);
  }
  if (from_msg == to_msg) {
    pcVar7 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (from_msg,to_msg,"&from != _this");
  }
  else {
    pcVar7 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar7 == (Nonnull<const_char_*>)0x0) {
    uVar1 = (uint)from_msg[2]._internal_metadata_.ptr_;
    if ((uVar1 & 0xf) != 0) {
      if ((uVar1 & 1) != 0) {
        puVar5 = (undefined8 *)((ulong)from_msg[3]._vptr_MessageLite & 0xfffffffffffffffc);
        pcVar2 = (char *)*puVar5;
        sVar3 = puVar5[1];
        *(uint *)&to_msg[2]._internal_metadata_.ptr_ = (uint)to_msg[2]._internal_metadata_.ptr_ | 1;
        arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
        if (((ulong)arena & 1) != 0) {
          arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
        }
        value._M_str = pcVar2;
        value._M_len = sVar3;
        google::protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)(to_msg + 3),value,arena);
      }
      if ((uVar1 & 2) != 0) {
        from_msg_00 = (MessageLite *)from_msg[3]._internal_metadata_.ptr_;
        if (from_msg_00 == (MessageLite *)0x0) {
          MergeImpl((TestFieldOrderings *)&stack0xffffffffffffffd0);
          goto LAB_00c551e8;
        }
        to_msg_00 = (MessageLite *)to_msg[3]._internal_metadata_.ptr_;
        if (to_msg_00 == (MessageLite *)0x0) {
          pvVar6 = google::protobuf::Arena::
                   CopyConstruct<edition_unittest::TestFieldOrderings_NestedMessage>
                             (arena_00,from_msg_00);
          to_msg[3]._internal_metadata_.ptr_ = (intptr_t)pvVar6;
        }
        else {
          TestFieldOrderings_NestedMessage::MergeImpl(to_msg_00,from_msg_00);
        }
      }
      if ((uVar1 & 4) != 0) {
        to_msg[4]._vptr_MessageLite = from_msg[4]._vptr_MessageLite;
      }
      if ((uVar1 & 8) != 0) {
        *(int *)&to_msg[4]._internal_metadata_.ptr_ = (int)from_msg[4]._internal_metadata_.ptr_;
      }
    }
    *(uint *)&to_msg[2]._internal_metadata_.ptr_ = (uint)to_msg[2]._internal_metadata_.ptr_ | uVar1;
    google::protobuf::internal::ExtensionSet::MergeFrom
              ((ExtensionSet *)(to_msg + 1),(MessageLite *)_TestFieldOrderings_default_instance_,
               (ExtensionSet *)(from_msg + 1));
    uVar4 = (from_msg->_internal_metadata_).ptr_;
    if ((uVar4 & 1) == 0) {
      return;
    }
    google::protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar4 & 0xfffffffffffffffe) + 8));
    return;
  }
LAB_00c551e8:
  MergeImpl();
}

Assistant:

void TestFieldOrderings::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestFieldOrderings*>(&to_msg);
  auto& from = static_cast<const TestFieldOrderings&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:edition_unittest.TestFieldOrderings)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000000fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_my_string(from._internal_my_string());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(from._impl_.optional_nested_message_ != nullptr);
      if (_this->_impl_.optional_nested_message_ == nullptr) {
        _this->_impl_.optional_nested_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optional_nested_message_);
      } else {
        _this->_impl_.optional_nested_message_->MergeFrom(*from._impl_.optional_nested_message_);
      }
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.my_int_ = from._impl_.my_int_;
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_impl_.my_float_ = from._impl_.my_float_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_impl_._extensions_.MergeFrom(&default_instance(), from._impl_._extensions_);
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}